

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_import(Context *context,IntrinsicResult *partialResult)

{
  TextOutputMethod *pp_Var1;
  byte bVar2;
  Context *pCVar3;
  long lVar4;
  RefCountedStorage *pRVar5;
  size_t sVar6;
  undefined1 auVar7 [8];
  ListStorage<MiniScript::String> *pLVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  byte *pbVar12;
  long *plVar13;
  undefined8 *puVar14;
  StringStorage *pSVar15;
  char *pcVar16;
  anon_union_8_3_2f476f46_for_data aVar17;
  _func_int **pp_Var18;
  unsigned_long uVar19;
  anon_union_8_3_2f476f46_for_data *paVar20;
  anon_union_8_3_2f476f46_for_data aVar21;
  long lVar22;
  anon_union_8_3_2f476f46_for_data aVar23;
  FILE *__stream;
  undefined4 extraout_var;
  Interpreter *pIVar24;
  TextOutputMethod p_Var25;
  FunctionStorage *func;
  long *in_RDX;
  anon_union_8_3_2f476f46_for_data aVar26;
  size_t *psVar27;
  TextOutputMethod __n;
  size_t sVar28;
  undefined1 *puVar29;
  long lVar30;
  ulong __n_00;
  ulong uVar31;
  ulong uVar32;
  unsigned_long uVar33;
  long lVar34;
  Value importedValues;
  String libname_1;
  Value searchPath;
  Parser parser;
  StringList libDirs;
  String libname;
  String moduleSource;
  anon_union_8_3_2f476f46_for_data local_240;
  RefCountedStorage *local_238;
  anon_union_8_3_2f476f46_for_data local_230;
  undefined1 local_228 [8];
  anon_union_8_3_2f476f46_for_data local_220;
  anon_union_8_3_2f476f46_for_data local_218;
  anon_union_8_3_2f476f46_for_data local_210;
  anon_union_8_3_2f476f46_for_data local_208;
  anon_union_8_3_2f476f46_for_data local_200;
  ValueType local_1f8;
  anon_union_8_3_2f476f46_for_data local_1f0;
  anon_union_8_3_2f476f46_for_data local_1e8;
  anon_union_8_3_2f476f46_for_data local_1e0;
  anon_union_8_3_2f476f46_for_data local_1d8;
  anon_union_8_3_2f476f46_for_data local_1d0;
  Context *local_1c8;
  anon_union_8_3_2f476f46_for_data local_1c0;
  anon_union_8_3_2f476f46_for_data local_1b8;
  anon_union_8_3_2f476f46_for_data local_1b0;
  undefined1 local_1a8 [8];
  long *local_1a0;
  undefined1 local_198 [8];
  StringStorage *local_190;
  bool local_188;
  anon_union_8_3_2f476f46_for_data local_180;
  StringStorage *local_178;
  anon_union_8_3_2f476f46_for_data local_170 [13];
  List<MiniScript::String> local_108;
  anon_union_8_3_2f476f46_for_data local_f8;
  char local_f0;
  String *local_e8;
  String local_e0;
  Value local_d0;
  Value local_c0;
  String local_b0;
  anon_union_8_3_2f476f46_for_data local_a0;
  char local_98;
  size_t local_90;
  StringStorage *local_88;
  char local_80;
  long *local_78;
  char local_70;
  anon_union_8_3_2f476f46_for_data local_68;
  char local_60;
  ulong local_58;
  Value local_50;
  unsigned_long local_40;
  unsigned_long local_38;
  
  if (*in_RDX == 0) {
    pbVar12 = &MiniScript::Value::null;
  }
  else {
    pbVar12 = (byte *)(*in_RDX + 0x18);
  }
  bVar2 = *pbVar12;
  local_198 = *(undefined1 (*) [8])(pbVar12 + 8);
  if ((2 < bVar2) && (local_198 != (undefined1  [8])0x0)) {
    ((Interpreter *)local_198)->standardOutput = ((Interpreter *)local_198)->standardOutput + 1;
  }
  local_1c8 = context;
  local_e8 = (String *)partialResult;
  if ((2 < bVar2) && (local_198 != (undefined1  [8])0x0)) {
    pp_Var1 = &((Interpreter *)local_198)->standardOutput;
    *pp_Var1 = *pp_Var1 + -1;
    if (*pp_Var1 == (TextOutputMethod)0x0) {
      (*((Interpreter *)local_198)->_vptr_Interpreter[1])();
    }
    local_198 = (undefined1  [8])0x0;
  }
  if (bVar2 != 0) {
    MiniScript::Context::GetTemp((Context *)&local_240,(int)local_e8);
    if (*in_RDX == 0) {
      pbVar12 = &MiniScript::Value::null;
    }
    else {
      pbVar12 = (byte *)(*in_RDX + 0x18);
    }
    local_198._0_3_ = *(undefined3 *)pbVar12;
    local_190 = *(StringStorage **)(pbVar12 + 8);
    if ((2 < *pbVar12) && (local_190 != (StringStorage *)0x0)) {
      plVar13 = &(local_190->super_RefCountedStorage).refCount;
      *plVar13 = *plVar13 + 1;
    }
    MiniScript::Value::ToString((Value *)&local_200,(Machine *)local_198);
    if ((2 < (byte)local_198[0]) && (local_190 != (StringStorage *)0x0)) {
      plVar13 = &(local_190->super_RefCountedStorage).refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_190->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_190 = (StringStorage *)0x0;
    }
    aVar17 = local_240;
    pCVar3 = *(Context **)&local_e8[5].isTemp;
    local_60 = '\0';
    local_68.number = local_200.number;
    if (local_200.ref != (RefCountedStorage *)0x0) {
      (local_200.ref)->refCount = (local_200.ref)->refCount + 1;
    }
    local_d0.type = local_240.tempNum._0_1_;
    local_d0.noInvoke = (bool)local_240.tempNum._1_1_;
    local_d0.localOnly = local_240.tempNum._2_1_;
    local_d0.data.ref = local_238;
    if ((2 < (byte)local_240.tempNum._0_1_) && (local_238 != (RefCountedStorage *)0x0)) {
      local_238->refCount = local_238->refCount + 1;
    }
    local_240 = aVar17;
    MiniScript::Context::SetVar(pCVar3,(String *)&local_68,&local_d0);
    if ((Temp < local_d0.type) && (local_d0.data.ref != (RefCountedStorage *)0x0)) {
      plVar13 = &(local_d0.data.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_d0.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_d0.data.number = 0.0;
    }
    if ((local_68.ref != (RefCountedStorage *)0x0) && (local_60 == '\0')) {
      plVar13 = &(local_68.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_68.ref)->_vptr_RefCountedStorage[1])();
      }
      local_68.number = 0.0;
    }
    MiniScript::IntrinsicResult::ensureStorage
              ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    pp_Var18 = MiniScript::IntrinsicResult::Null;
    ((RefCountedStorage *)&local_1c8->code)->_vptr_RefCountedStorage =
         MiniScript::IntrinsicResult::Null;
    if (pp_Var18 != (_func_int **)0x0) {
      pp_Var18 = pp_Var18 + 1;
      *pp_Var18 = *pp_Var18 + 1;
    }
    if ((local_200.ref != (RefCountedStorage *)0x0) && (local_1f8 == Null)) {
      plVar13 = &(local_200.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_200.ref)->_vptr_RefCountedStorage[1])();
      }
      local_200.number = 0.0;
    }
    if ((byte)local_240.tempNum._0_1_ < 3) {
      return (IntrinsicResult)(IntrinsicResultStorage *)local_1c8;
    }
    if (local_238 == (RefCountedStorage *)0x0) {
      return (IntrinsicResult)(IntrinsicResultStorage *)local_1c8;
    }
    plVar13 = &local_238->refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 != 0) {
      return (IntrinsicResult)(IntrinsicResultStorage *)local_1c8;
    }
    (*local_238->_vptr_RefCountedStorage[1])();
    return (IntrinsicResult)(IntrinsicResultStorage *)local_1c8;
  }
  local_70 = '\0';
  plVar13 = (long *)operator_new(0x30);
  plVar13[1] = 1;
  *plVar13 = (long)&PTR__StringStorage_001d10b0;
  plVar13[3] = 8;
  plVar13[4] = -1;
  puVar14 = (undefined8 *)operator_new__(8);
  plVar13[2] = (long)puVar14;
  *puVar14 = 0;
  *puVar14 = 0x656d616e62696c;
  local_78 = plVar13;
  MiniScript::Context::GetVar((Context *)&local_240,local_e8,(LocalOnlyMode)&local_78);
  paVar20 = &local_240;
  MiniScript::Value::ToString((Value *)&local_f8,(Machine *)paVar20);
  iVar11 = (int)paVar20;
  if ((2 < (byte)local_240.tempNum._0_1_) && (local_238 != (RefCountedStorage *)0x0)) {
    plVar13 = &local_238->refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*local_238->_vptr_RefCountedStorage[1])();
    }
    local_238 = (RefCountedStorage *)0x0;
  }
  if ((local_78 != (long *)0x0) && (local_70 == '\0')) {
    plVar13 = local_78 + 1;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (**(code **)(*local_78 + 8))();
    }
    local_78 = (long *)0x0;
  }
  if ((local_f8.ref == (RefCountedStorage *)0x0) || ((ulong)local_f8.ref[1].refCount < 2)) {
    pSVar15 = (StringStorage *)operator_new(0x30);
    (pSVar15->super_RefCountedStorage).refCount = 1;
    (pSVar15->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar15->dataSize = 0x19;
    pSVar15->charCount = -1;
    pcVar16 = (char *)operator_new__(0x19);
    pSVar15->data = pcVar16;
    builtin_strncpy(pcVar16 + 9,"ibname required",0x10);
    plVar13 = &(pSVar15->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + 1;
    builtin_strncpy(pcVar16,"import: libname ",0x10);
    local_198 = (undefined1  [8])&PTR__MiniscriptException_001d1358;
    local_190 = (StringStorage *)0x0;
    local_188 = false;
    local_180.tempNum = 0;
    local_170[0].tempNum._0_1_ = false;
    local_178 = pSVar15;
    if ((pSVar15->super_RefCountedStorage).refCount == 0) {
      (*(pSVar15->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar15);
    }
    local_198 = (undefined1  [8])&PTR__MiniscriptException_001d1308;
    MiniScript::RuntimeException::raise((RuntimeException *)local_198,iVar11);
    local_198 = (undefined1  [8])&PTR__MiniscriptException_001d1358;
    if ((local_178 != (StringStorage *)0x0) && ((bool)local_170[0]._0_1_ == false)) {
      plVar13 = &(local_178->super_RefCountedStorage).refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_178->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_178 = (StringStorage *)0x0;
    }
    if ((local_190 != (StringStorage *)0x0) && (local_188 == false)) {
      plVar13 = &(local_190->super_RefCountedStorage).refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_190->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_190 = (StringStorage *)0x0;
    }
    std::exception::~exception((exception *)local_198);
    plVar13 = &(pSVar15->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(pSVar15->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar15);
    }
  }
  getEnvMap();
  pSVar15 = local_190;
  if (local_190 == (StringStorage *)0x0) {
LAB_00128f44:
    local_1a8._1_2_ = DAT_001d3321;
    local_1a0 = DAT_001d3328;
    local_1a8[0] = MiniScript::Value::null;
  }
  else {
    uVar10 = MiniScript::HashValue(&_MS_IMPORT_PATH);
    psVar27 = &pSVar15->dataSize + uVar10 % 0xfb;
    do {
      psVar27 = (size_t *)*psVar27;
      if (psVar27 == (size_t *)0x0) goto LAB_00128f44;
      bVar9 = MiniScript::Value::operator==((Value *)(psVar27 + 1),&_MS_IMPORT_PATH);
    } while (!bVar9);
    local_1a8._1_2_ = *(undefined2 *)((long)psVar27 + 0x19);
    local_1a0 = (long *)psVar27[4];
    local_1a8[0] = *(byte *)(psVar27 + 3);
  }
  if (local_1a0 != (long *)0x0 && 2 < local_1a8[0]) {
    local_1a0[1] = local_1a0[1] + 1;
  }
  local_198 = (undefined1  [8])&PTR__Dictionary_001d1238;
  if ((pSVar15 != (StringStorage *)0x0) && (local_188 == false)) {
    plVar13 = &(pSVar15->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(pSVar15->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar15);
    }
    local_190 = (StringStorage *)0x0;
  }
  local_108.ls = (ListStorage<MiniScript::String> *)0x0;
  local_108.isTemp = false;
  if (local_1a8[0] != 0) {
    MiniScript::Value::ToString((Value *)&local_240,(Machine *)local_1a8);
    local_1f8 = Null;
    aVar17.ref = (RefCountedStorage *)operator_new(0x30);
    (aVar17.ref)->refCount = 1;
    (aVar17.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
    aVar17.ref[1].refCount = 2;
    aVar17.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    pp_Var18 = (_func_int **)operator_new__(2);
    aVar17.ref[1]._vptr_RefCountedStorage = pp_Var18;
    *(undefined2 *)pp_Var18 = 0;
    *(undefined2 *)pp_Var18 = 0x3a;
    local_200.ref = aVar17.ref;
    MiniScript::Split((MiniScript *)local_198,(String *)&local_240,(String *)&local_200,-1);
    MiniScript::List<MiniScript::String>::operator=
              (&local_108,(List<MiniScript::String> *)local_198);
    if ((local_198 != (undefined1  [8])0x0) && (local_190._0_1_ == false)) {
      pp_Var1 = (TextOutputMethod *)((long)local_198 + 8);
      *pp_Var1 = *pp_Var1 + -1;
      if (*pp_Var1 == (TextOutputMethod)0x0) {
        (*(*(_func_int ***)local_198)[1])();
        local_198 = (undefined1  [8])0x0;
      }
    }
    if ((local_200.ref != (RefCountedStorage *)0x0) && (local_1f8 == Null)) {
      plVar13 = &(local_200.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_200.ref)->_vptr_RefCountedStorage[1])();
      }
      local_200.number = 0.0;
    }
    if ((local_240.ref != (RefCountedStorage *)0x0) && ((char)local_238 == '\0')) {
      plVar13 = &(local_240.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_240.ref)->_vptr_RefCountedStorage[1])();
      }
      local_240.number = 0.0;
    }
  }
  local_e0.ss = (StringStorage *)0x0;
  local_e0.isTemp = false;
  if (local_108.ls == (ListStorage<MiniScript::String> *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar19 = ((local_108.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
  }
  if (0 < (long)uVar19) {
    local_58 = 0;
    uVar33 = 0;
    local_40 = uVar19;
LAB_0012913b:
    if (local_108.ls == (ListStorage<MiniScript::String> *)0x0) {
      MiniScript::_Error("Assert failed: ls",
                         "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                         ,0x3b);
    }
    pLVar8 = local_108.ls;
    local_38 = uVar33;
    if ((long)uVar33 < (long)((local_108.ls)->super_SimpleVector<MiniScript::String>).mQtyItems) {
      paVar20 = (anon_union_8_3_2f476f46_for_data *)
                (((local_108.ls)->super_SimpleVector<MiniScript::String>).mBuf + uVar33);
    }
    else {
      MiniScript::_Error("invalid index in SimpleVector::operator[]",
                         "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                         ,0xc1);
      paVar20 = (anon_union_8_3_2f476f46_for_data *)
                (pLVar8->super_SimpleVector<MiniScript::String>).mBuf;
    }
    local_1d0.tempNum._0_1_ = '\0';
    aVar17 = (anon_union_8_3_2f476f46_for_data)paVar20->ref;
    local_1d8 = aVar17;
    if (aVar17.ref != (RefCountedStorage *)0x0) {
      (aVar17.ref)->refCount = (aVar17.ref)->refCount + 1;
      if (1 < (ulong)aVar17.ref[1].refCount) {
        if (aVar17.ref == (RefCountedStorage *)0x0) {
          lVar22 = -1;
        }
        else {
          lVar22 = aVar17.ref[1].refCount + -2;
        }
        if (*(char *)((long)aVar17.ref[1]._vptr_RefCountedStorage + lVar22) != '/') {
          local_190 = (StringStorage *)((ulong)local_190 & 0xffffffffffffff00);
          pIVar24 = (Interpreter *)operator_new(0x30);
          pIVar24->standardOutput = (TextOutputMethod)0x1;
          pIVar24->_vptr_Interpreter = (_func_int **)&PTR__StringStorage_001d10b0;
          pIVar24->errorOutput = (TextOutputMethod)0x2;
          pIVar24->hostData = (void *)0xffffffffffffffff;
          p_Var25 = (TextOutputMethod)operator_new__(2);
          pIVar24->implicitOutput = p_Var25;
          *(undefined2 *)p_Var25 = 0;
          *(undefined2 *)p_Var25 = 0x2f;
          local_198 = (undefined1  [8])pIVar24;
          if (aVar17.ref == (RefCountedStorage *)0x0) {
            MiniScript::String::operator=((String *)&local_1d8,(String *)local_198);
          }
          else {
            lVar22 = aVar17.ref[1].refCount;
            aVar21.ref = (RefCountedStorage *)operator_new(0x30);
            uVar32 = lVar22 + 1;
            (aVar21.ref)->refCount = 1;
            (aVar21.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
            aVar21.ref[1].refCount = uVar32;
            aVar21.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
            pp_Var18 = (_func_int **)operator_new__(uVar32);
            local_1c0.ref = (RefCountedStorage *)(lVar22 + -1);
            aVar21.ref[1]._vptr_RefCountedStorage = pp_Var18;
            memset(pp_Var18,0,uVar32);
            memcpy(pp_Var18,aVar17.ref[1]._vptr_RefCountedStorage,(size_t)local_1c0);
            *(undefined2 *)((long)pp_Var18 + lVar22 + -1) = *(undefined2 *)p_Var25;
            plVar13 = &(aVar17.ref)->refCount;
            *plVar13 = *plVar13 + -1;
            if (*plVar13 == 0) {
              (*(aVar17.ref)->_vptr_RefCountedStorage[1])(aVar17.number);
            }
            local_1d0.tempNum._0_1_ = '\0';
            local_1d8.ref = aVar21.ref;
          }
          if ((local_198 != (undefined1  [8])0x0) && (local_190._0_1_ == false)) {
            pp_Var1 = (TextOutputMethod *)((long)local_198 + 8);
            *pp_Var1 = *pp_Var1 + -1;
            if (*pp_Var1 == (TextOutputMethod)0x0) {
              (*(*(_func_int ***)local_198)[1])();
            }
            local_198 = (undefined1  [8])0x0;
          }
        }
        goto LAB_0012922c;
      }
      if (aVar17.ref != (RefCountedStorage *)0x0) {
        plVar13 = &(aVar17.ref)->refCount;
        *plVar13 = *plVar13 + -1;
        if (*plVar13 == 0) {
          (*(aVar17.ref)->_vptr_RefCountedStorage[1])(aVar17.number);
        }
        local_1d8.number = 0.0;
      }
    }
    aVar17.ref = (RefCountedStorage *)operator_new(0x30);
    (aVar17.ref)->refCount = 1;
    (aVar17.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
    aVar17.ref[1].refCount = 2;
    aVar17.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    pp_Var18 = (_func_int **)operator_new__(2);
    aVar17.ref[1]._vptr_RefCountedStorage = pp_Var18;
    *(undefined2 *)pp_Var18 = 0;
    *(undefined2 *)pp_Var18 = 0x2e;
    local_1d0.tempNum._0_1_ = '\0';
    local_1d8.ref = aVar17.ref;
LAB_0012922c:
    MiniScript::String::operator+((String *)local_198,(char *)&local_f8.tempNum);
    auVar7 = local_198;
    if (local_198 != (undefined1  [8])0x0) {
      if (local_1d8.ref == (RefCountedStorage *)0x0) {
        MiniScript::String::operator=((String *)&local_1d8,(String *)local_198);
      }
      else {
        local_1c0.number = local_1d8.number;
        lVar22 = local_1d8.ref[1].refCount;
        p_Var25 = *(TextOutputMethod *)((long)local_198 + 0x18);
        aVar21.ref = (RefCountedStorage *)operator_new(0x30);
        __n = p_Var25 + lVar22 + -1;
        (aVar21.ref)->refCount = 1;
        (aVar21.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
        aVar21.ref[1].refCount = (long)__n;
        aVar21.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
        pp_Var18 = (_func_int **)operator_new__((ulong)__n);
        sVar28 = lVar22 - 1;
        aVar21.ref[1]._vptr_RefCountedStorage = pp_Var18;
        memset(pp_Var18,0,(size_t)__n);
        aVar17 = local_1c0;
        memcpy(pp_Var18,local_1c0.ref[1]._vptr_RefCountedStorage,sVar28);
        memcpy((void *)(sVar28 + (long)pp_Var18),*(TextOutputMethod *)((long)auVar7 + 0x10),
               (size_t)p_Var25);
        if (local_1d0.tempNum._0_1_ == '\0') {
          plVar13 = &(aVar17.ref)->refCount;
          *plVar13 = *plVar13 + -1;
          if (*plVar13 == 0) {
            (*(aVar17.ref)->_vptr_RefCountedStorage[1])(aVar17.number);
          }
        }
        local_1d0.tempNum._0_1_ = '\0';
        local_1d8.ref = aVar21.ref;
      }
    }
    if ((local_198 != (undefined1  [8])0x0) && (local_190._0_1_ == false)) {
      pp_Var1 = (TextOutputMethod *)((long)local_198 + 8);
      *pp_Var1 = *pp_Var1 + -1;
      if (*pp_Var1 == (TextOutputMethod)0x0) {
        (*(*(_func_int ***)local_198)[1])();
      }
      local_198 = (undefined1  [8])0x0;
    }
    local_1b0.tempNum._0_1_ = '\0';
    local_1b8.number = local_1d8.number;
    if (local_1d8.ref == (RefCountedStorage *)0x0) {
      local_1c0.number = 0.0;
    }
    else {
      (local_1d8.ref)->refCount = (local_1d8.ref)->refCount + 1;
      local_1c0.ref = (RefCountedStorage *)(local_1d8.ref[1].refCount - 1);
    }
    getEnvMap();
LAB_001293bc:
    aVar17 = local_1b8;
    lVar34 = -1;
    lVar22 = lVar34;
    if ((local_1b8.ref != (RefCountedStorage *)0x0) &&
       (lVar4 = local_1b8.ref[1].refCount, -1 < lVar4 + -3)) {
      pp_Var18 = local_1b8.ref[1]._vptr_RefCountedStorage;
      lVar30 = 0;
      do {
        iVar11 = strncmp((char *)((long)pp_Var18 + lVar30),"${",2);
        lVar22 = lVar30;
        if (iVar11 == 0) break;
        lVar30 = lVar30 + 1;
        lVar22 = lVar34;
      } while (lVar4 + -2 != lVar30);
    }
    if (lVar22 < 0) {
LAB_001294f9:
      lVar34 = -1;
      lVar22 = lVar34;
      if ((aVar17.ref != (RefCountedStorage *)0x0) &&
         (lVar4 = aVar17.ref[1].refCount, -1 < lVar4 + -3)) {
        pp_Var18 = aVar17.ref[1]._vptr_RefCountedStorage;
        lVar30 = 0;
        do {
          iVar11 = strncmp((char *)((long)pp_Var18 + lVar30),"$(",2);
          lVar22 = lVar30;
          if (iVar11 == 0) break;
          lVar30 = lVar30 + 1;
          lVar22 = lVar34;
        } while (lVar4 + -2 != lVar30);
      }
      if (-1 < lVar22) {
        uVar32 = 0;
        do {
          uVar31 = uVar32;
          if ((long)local_1c0.ref <= (long)(lVar22 + uVar31 + 1)) goto LAB_0012962e;
          uVar32 = uVar31 + 1;
        } while (*(char *)((long)aVar17.ref[1]._vptr_RefCountedStorage + uVar31 + 1 + lVar22) != ')'
                );
        if (aVar17.ref == (RefCountedStorage *)0x0) {
          local_1f0.number = aVar17.number;
        }
        else {
          pRVar5 = (RefCountedStorage *)aVar17.ref[1].refCount;
          if (lVar22 + 2U < pRVar5) {
            if ((uVar32 == 1) ||
               (aVar21.ref = (RefCountedStorage *)(uVar31 - 1),
               (long)pRVar5 + (-3 - lVar22) < (long)aVar21.ref)) {
              aVar21.ref = (RefCountedStorage *)((long)pRVar5 + (-3 - lVar22));
            }
            local_230.ref = (RefCountedStorage *)(lVar22 + 2U);
            aVar23.ref = (RefCountedStorage *)operator_new(0x30);
            puVar29 = (undefined1 *)((long)&(aVar21.ref)->_vptr_RefCountedStorage + 1);
            (aVar23.ref)->refCount = 1;
            (aVar23.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
            aVar23.ref[1].refCount = (long)puVar29;
            aVar23.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
            local_208 = aVar21;
            pp_Var18 = (_func_int **)operator_new__((ulong)puVar29);
            aVar23.ref[1]._vptr_RefCountedStorage = pp_Var18;
            local_1f0.ref = aVar23.ref;
            memset(pp_Var18,0,(size_t)puVar29);
            memcpy(pp_Var18,(void *)((long)&(local_230.ref)->_vptr_RefCountedStorage +
                                    (long)aVar17.ref[1]._vptr_RefCountedStorage),(size_t)local_208);
          }
          else {
            local_1f0.number = 0.0;
          }
        }
        MiniScript::String::Substring((String *)&local_200,(long)&local_1b8,0);
        pSVar15 = local_190;
        local_218.tempNum._0_2_ = 3;
        local_218.tempNum._2_1_ = 0;
        local_210 = local_1f0;
        if (local_1f0.ref == (RefCountedStorage *)0x0) {
          local_210 = DAT_001d3308;
        }
        if (local_210.ref != (RefCountedStorage *)0x0) {
          (local_210.ref)->refCount = (local_210.ref)->refCount + 1;
        }
        if (local_190 == (StringStorage *)0x0) {
LAB_00129f94:
          local_228._1_2_ = _DAT_001d3301;
          local_220 = DAT_001d3308;
          local_228[0] = MiniScript::Value::emptyString;
        }
        else {
          uVar10 = MiniScript::HashValue((Value *)&local_218);
          psVar27 = &pSVar15->dataSize + uVar10 % 0xfb;
          do {
            psVar27 = (size_t *)*psVar27;
            if (psVar27 == (size_t *)0x0) goto LAB_00129f94;
            bVar9 = MiniScript::Value::operator==((Value *)(psVar27 + 1),(Value *)&local_218);
          } while (!bVar9);
          local_228._1_2_ = *(undefined2 *)((long)psVar27 + 0x19);
          local_220.ref = ((anon_union_8_3_2f476f46_for_data *)(psVar27 + 4))->ref;
          local_228[0] = *(byte *)(psVar27 + 3);
        }
        if (local_220.ref != (RefCountedStorage *)0x0 && 2 < local_228[0]) {
          (local_220.ref)->refCount = (local_220.ref)->refCount + 1;
        }
        MiniScript::Value::ToString((Value *)&local_1e8,(Machine *)local_228);
        if (local_1e8.ref == (RefCountedStorage *)0x0) {
          aVar17 = local_200;
          if (local_200.ref != (RefCountedStorage *)0x0) {
            (local_200.ref)->refCount = (local_200.ref)->refCount + 1;
          }
        }
        else if (local_200.ref == (RefCountedStorage *)0x0) {
          (local_1e8.ref)->refCount = (local_1e8.ref)->refCount + 1;
          aVar17 = local_1e8;
        }
        else {
          local_208.number = local_200.number;
          lVar34 = local_200.ref[1].refCount;
          local_230.number = local_1e8.number;
          sVar28 = local_1e8.ref[1].refCount;
          aVar17.ref = (RefCountedStorage *)operator_new(0x30);
          uVar31 = lVar34 + (sVar28 - 1);
          (aVar17.ref)->refCount = 1;
          (aVar17.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
          aVar17.ref[1].refCount = uVar31;
          aVar17.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
          local_90 = sVar28;
          pp_Var18 = (_func_int **)operator_new__(uVar31);
          sVar28 = lVar34 - 1;
          aVar17.ref[1]._vptr_RefCountedStorage = pp_Var18;
          memset(pp_Var18,0,uVar31);
          memcpy(pp_Var18,local_208.ref[1]._vptr_RefCountedStorage,sVar28);
          memcpy((void *)(sVar28 + (long)pp_Var18),local_230.ref[1]._vptr_RefCountedStorage,local_90
                );
        }
        aVar21 = local_1b8;
        if (local_1b8.ref != (RefCountedStorage *)0x0) {
          uVar31 = local_1b8.ref[1].refCount;
          if (lVar22 + uVar32 + 1 < uVar31) {
            local_208 = aVar17;
            local_230.ref = (RefCountedStorage *)operator_new(0x30);
            __n_00 = uVar31 + (~uVar32 - lVar22);
            (local_230.ref)->refCount = 1;
            (local_230.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
            local_230.ref[1].refCount = __n_00;
            local_230.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
            pp_Var18 = (_func_int **)operator_new__(__n_00);
            local_230.ref[1]._vptr_RefCountedStorage = pp_Var18;
            memset(pp_Var18,0,__n_00);
            memcpy(pp_Var18,(void *)((long)aVar21.ref[1]._vptr_RefCountedStorage +
                                    uVar32 + lVar22 + 1),uVar31 + (-uVar32 - lVar22) + -2);
            aVar21 = local_230;
            aVar17 = local_208;
          }
          else {
            aVar21.number = 0.0;
          }
        }
        if (aVar21.ref == (RefCountedStorage *)0x0) {
          local_238 = (RefCountedStorage *)((ulong)local_238._1_7_ << 8);
          local_240 = aVar17;
          if (aVar17.ref != (RefCountedStorage *)0x0) {
            (aVar17.ref)->refCount = (aVar17.ref)->refCount + 1;
          }
        }
        else if (aVar17.ref == (RefCountedStorage *)0x0) {
          local_238 = (RefCountedStorage *)((ulong)local_238._1_7_ << 8);
          (aVar21.ref)->refCount = (aVar21.ref)->refCount + 1;
          local_240 = aVar21;
        }
        else {
          lVar22 = aVar17.ref[1].refCount;
          sVar28 = aVar21.ref[1].refCount;
          local_230 = aVar21;
          aVar23.ref = (RefCountedStorage *)operator_new(0x30);
          uVar32 = lVar22 + (sVar28 - 1);
          (aVar23.ref)->refCount = 1;
          (aVar23.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
          aVar23.ref[1].refCount = uVar32;
          aVar23.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
          pp_Var18 = (_func_int **)operator_new__(uVar32);
          sVar6 = lVar22 - 1;
          aVar23.ref[1]._vptr_RefCountedStorage = pp_Var18;
          memset(pp_Var18,0,uVar32);
          memcpy(pp_Var18,aVar17.ref[1]._vptr_RefCountedStorage,sVar6);
          aVar21 = local_230;
          memcpy((void *)(sVar6 + (long)pp_Var18),local_230.ref[1]._vptr_RefCountedStorage,sVar28);
          local_238 = (RefCountedStorage *)((ulong)local_238 & 0xffffffffffffff00);
          local_240.ref = aVar23.ref;
        }
        MiniScript::String::operator=((String *)&local_1b8,(String *)&local_240);
        goto LAB_0012a255;
      }
LAB_0012962e:
      aVar23.number = -NAN;
      aVar21.number = aVar23.number;
      if ((aVar17.ref != (RefCountedStorage *)0x0) && (-1 < aVar17.ref[1].refCount + -2)) {
        aVar26.number = 0.0;
        do {
          aVar21 = aVar26;
          if (*(char *)((long)&(aVar26.ref)->_vptr_RefCountedStorage +
                       (long)aVar17.ref[1]._vptr_RefCountedStorage) == '$') break;
          aVar26.ref = (RefCountedStorage *)((long)&(aVar26.ref)->_vptr_RefCountedStorage + 1);
          aVar21.number = aVar23.number;
        } while ((RefCountedStorage *)(aVar17.ref[1].refCount + -1) != aVar26.ref);
      }
      if ((long)aVar21.ref < 0) goto LAB_0012a360;
      aVar23.ref = (RefCountedStorage *)((long)&(aVar21.ref)->_vptr_RefCountedStorage + 1);
      aVar26.ref = aVar23.ref;
      do {
        if ((long)local_1c0.ref <= (long)aVar26.ref) break;
        bVar2 = *(byte *)((long)&(aVar26.ref)->_vptr_RefCountedStorage +
                         (long)aVar17.ref[1]._vptr_RefCountedStorage);
        if (((byte)(bVar2 - 0x3a) < 7 || (char)bVar2 < '0') ||
           ((bVar2 - 0x5b < 0x25 && ((0x1f0000002fU >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0))))
        {
          bVar9 = false;
        }
        else {
          aVar26.ref = (RefCountedStorage *)((long)&(aVar26.ref)->_vptr_RefCountedStorage + 1);
          bVar9 = true;
        }
      } while (bVar9);
      if (aVar17.ref == (RefCountedStorage *)0x0) {
        local_1f0.number = aVar17.number;
      }
      else {
        pRVar5 = (RefCountedStorage *)aVar17.ref[1].refCount;
        if ((ulong)aVar23 < pRVar5) {
          sVar28 = (long)&(aVar26.ref)->_vptr_RefCountedStorage + ~(ulong)aVar21.ref;
          if ((sVar28 == 0xffffffffffffffff) || ((long)pRVar5 + (-2 - (long)aVar21) < (long)sVar28))
          {
            sVar28 = (long)pRVar5 + (-2 - (long)aVar21);
          }
          local_230 = aVar21;
          local_208.ref = aVar23.ref;
          aVar21.ref = (RefCountedStorage *)operator_new(0x30);
          uVar32 = sVar28 + 1;
          (aVar21.ref)->refCount = 1;
          (aVar21.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
          aVar21.ref[1].refCount = uVar32;
          aVar21.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
          pp_Var18 = (_func_int **)operator_new__(uVar32);
          aVar21.ref[1]._vptr_RefCountedStorage = pp_Var18;
          local_1f0.ref = aVar21.ref;
          memset(pp_Var18,0,uVar32);
          memcpy(pp_Var18,(void *)((long)&(local_208.ref)->_vptr_RefCountedStorage +
                                  (long)aVar17.ref[1]._vptr_RefCountedStorage),sVar28);
        }
        else {
          local_1f0.number = 0.0;
        }
      }
      MiniScript::String::Substring((String *)&local_200,(long)&local_1b8,0);
      pSVar15 = local_190;
      local_218.tempNum._0_2_ = 3;
      local_218.tempNum._2_1_ = 0;
      local_210 = local_1f0;
      if (local_1f0.ref == (RefCountedStorage *)0x0) {
        local_210 = DAT_001d3308;
      }
      if (local_210.ref != (RefCountedStorage *)0x0) {
        (local_210.ref)->refCount = (local_210.ref)->refCount + 1;
      }
      if (local_190 == (StringStorage *)0x0) {
LAB_00129a3f:
        local_228._1_2_ = _DAT_001d3301;
        local_220 = DAT_001d3308;
        local_228[0] = MiniScript::Value::emptyString;
      }
      else {
        uVar10 = MiniScript::HashValue((Value *)&local_218);
        psVar27 = &pSVar15->dataSize + uVar10 % 0xfb;
        do {
          psVar27 = (size_t *)*psVar27;
          if (psVar27 == (size_t *)0x0) goto LAB_00129a3f;
          bVar9 = MiniScript::Value::operator==((Value *)(psVar27 + 1),(Value *)&local_218);
        } while (!bVar9);
        local_228._1_2_ = *(undefined2 *)((long)psVar27 + 0x19);
        local_220.ref = ((anon_union_8_3_2f476f46_for_data *)(psVar27 + 4))->ref;
        local_228[0] = *(byte *)(psVar27 + 3);
      }
      if (local_220.ref != (RefCountedStorage *)0x0 && 2 < local_228[0]) {
        (local_220.ref)->refCount = (local_220.ref)->refCount + 1;
      }
      MiniScript::Value::ToString((Value *)&local_1e8,(Machine *)local_228);
      aVar17 = local_1e8;
      if (local_1e8.ref == (RefCountedStorage *)0x0) {
        local_230 = local_200;
        if (local_200.ref != (RefCountedStorage *)0x0) {
          (local_200.ref)->refCount = (local_200.ref)->refCount + 1;
        }
      }
      else if (local_200.ref == (RefCountedStorage *)0x0) {
        (local_1e8.ref)->refCount = (local_1e8.ref)->refCount + 1;
        local_230 = local_1e8;
      }
      else {
        local_230.number = local_200.number;
        lVar22 = local_200.ref[1].refCount;
        aVar21 = (anon_union_8_3_2f476f46_for_data)local_1e8.ref[1].refCount;
        aVar23.ref = (RefCountedStorage *)operator_new(0x30);
        uVar32 = (long)aVar21.ref + lVar22 + -1;
        (aVar23.ref)->refCount = 1;
        (aVar23.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
        aVar23.ref[1].refCount = uVar32;
        aVar23.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
        local_208 = aVar21;
        pp_Var18 = (_func_int **)operator_new__(uVar32);
        sVar28 = lVar22 - 1;
        aVar23.ref[1]._vptr_RefCountedStorage = pp_Var18;
        memset(pp_Var18,0,uVar32);
        memcpy(pp_Var18,local_230.ref[1]._vptr_RefCountedStorage,sVar28);
        memcpy((void *)(sVar28 + (long)pp_Var18),aVar17.ref[1]._vptr_RefCountedStorage,
               (size_t)local_208);
        local_230.ref = aVar23.ref;
      }
      aVar17 = local_1b8;
      aVar21 = local_1b8;
      if (local_1b8.ref != (RefCountedStorage *)0x0) {
        pRVar5 = (RefCountedStorage *)local_1b8.ref[1].refCount;
        uVar32 = (long)pRVar5 - (long)aVar26;
        if (pRVar5 < aVar26.ref || uVar32 == 0) {
          aVar21.number = 0.0;
        }
        else {
          aVar21.ref = (RefCountedStorage *)operator_new(0x30);
          (aVar21.ref)->refCount = 1;
          (aVar21.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
          aVar21.ref[1].refCount = uVar32;
          aVar21.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
          pp_Var18 = (_func_int **)operator_new__(uVar32);
          aVar21.ref[1]._vptr_RefCountedStorage = pp_Var18;
          memset(pp_Var18,0,uVar32);
          memcpy(pp_Var18,(void *)((long)&(aVar26.ref)->_vptr_RefCountedStorage +
                                  (long)aVar17.ref[1]._vptr_RefCountedStorage),
                 (long)pRVar5 + 0x18 + (~(ulong)aVar26.ref - 0x18));
        }
      }
      aVar17 = local_230;
      if (aVar21.ref == (RefCountedStorage *)0x0) {
        local_238 = (RefCountedStorage *)((ulong)local_238._1_7_ << 8);
        local_240 = local_230;
        if (local_230.ref != (RefCountedStorage *)0x0) {
          (local_230.ref)->refCount = (local_230.ref)->refCount + 1;
        }
      }
      else if (local_230.ref == (RefCountedStorage *)0x0) {
        local_238 = (RefCountedStorage *)((ulong)local_238._1_7_ << 8);
        (aVar21.ref)->refCount = (aVar21.ref)->refCount + 1;
        local_240 = aVar21;
      }
      else {
        lVar22 = local_230.ref[1].refCount;
        sVar28 = aVar21.ref[1].refCount;
        aVar23.ref = (RefCountedStorage *)operator_new(0x30);
        uVar32 = lVar22 + (sVar28 - 1);
        (aVar23.ref)->refCount = 1;
        (aVar23.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
        aVar23.ref[1].refCount = uVar32;
        aVar23.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
        pp_Var18 = (_func_int **)operator_new__(uVar32);
        sVar6 = lVar22 - 1;
        aVar23.ref[1]._vptr_RefCountedStorage = pp_Var18;
        memset(pp_Var18,0,uVar32);
        aVar17 = local_230;
        memcpy(pp_Var18,local_230.ref[1]._vptr_RefCountedStorage,sVar6);
        memcpy((void *)(sVar6 + (long)pp_Var18),aVar21.ref[1]._vptr_RefCountedStorage,sVar28);
        local_238 = (RefCountedStorage *)((ulong)local_238 & 0xffffffffffffff00);
        local_240.ref = aVar23.ref;
      }
      MiniScript::String::operator=((String *)&local_1b8,(String *)&local_240);
      if ((local_240.ref != (RefCountedStorage *)0x0) && ((char)local_238 == '\0')) {
        plVar13 = &(local_240.ref)->refCount;
        *plVar13 = *plVar13 + -1;
        if (*plVar13 == 0) {
          (*(local_240.ref)->_vptr_RefCountedStorage[1])();
        }
        local_240.number = 0.0;
      }
      if (aVar21.ref != (RefCountedStorage *)0x0) {
        plVar13 = &(aVar21.ref)->refCount;
        *plVar13 = *plVar13 + -1;
        if (*plVar13 == 0) {
          (*(aVar21.ref)->_vptr_RefCountedStorage[1])(aVar21.number);
        }
      }
      if (aVar17.ref != (RefCountedStorage *)0x0) {
        plVar13 = &(aVar17.ref)->refCount;
        *plVar13 = *plVar13 + -1;
        if (*plVar13 != 0) goto LAB_0012a2a5;
        pp_Var18 = (aVar17.ref)->_vptr_RefCountedStorage;
        goto LAB_0012a2a2;
      }
    }
    else {
      uVar32 = 0;
      do {
        uVar31 = uVar32;
        if ((long)local_1c0.ref <= (long)(lVar22 + uVar31 + 1)) goto LAB_001294f9;
        uVar32 = uVar31 + 1;
      } while (*(char *)((long)aVar17.ref[1]._vptr_RefCountedStorage + uVar31 + 1 + lVar22) != '}');
      if (aVar17.ref == (RefCountedStorage *)0x0) {
        local_1f0.number = aVar17.number;
      }
      else {
        pRVar5 = (RefCountedStorage *)aVar17.ref[1].refCount;
        if (lVar22 + 2U < pRVar5) {
          if ((uVar32 == 1) ||
             (aVar21.ref = (RefCountedStorage *)(uVar31 - 1),
             (long)pRVar5 + (-3 - lVar22) < (long)aVar21.ref)) {
            aVar21.ref = (RefCountedStorage *)((long)pRVar5 + (-3 - lVar22));
          }
          local_230.ref = (RefCountedStorage *)(lVar22 + 2U);
          aVar23.ref = (RefCountedStorage *)operator_new(0x30);
          puVar29 = (undefined1 *)((long)&(aVar21.ref)->_vptr_RefCountedStorage + 1);
          (aVar23.ref)->refCount = 1;
          (aVar23.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
          aVar23.ref[1].refCount = (long)puVar29;
          aVar23.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
          local_208 = aVar21;
          pp_Var18 = (_func_int **)operator_new__((ulong)puVar29);
          aVar23.ref[1]._vptr_RefCountedStorage = pp_Var18;
          local_1f0.ref = aVar23.ref;
          memset(pp_Var18,0,(size_t)puVar29);
          memcpy(pp_Var18,(void *)((long)&(local_230.ref)->_vptr_RefCountedStorage +
                                  (long)aVar17.ref[1]._vptr_RefCountedStorage),(size_t)local_208);
        }
        else {
          local_1f0.number = 0.0;
        }
      }
      MiniScript::String::Substring((String *)&local_200,(long)&local_1b8,0);
      pSVar15 = local_190;
      local_218.tempNum._0_2_ = 3;
      local_218.tempNum._2_1_ = 0;
      local_210 = local_1f0;
      if (local_1f0.ref == (RefCountedStorage *)0x0) {
        local_210 = DAT_001d3308;
      }
      if (local_210.ref != (RefCountedStorage *)0x0) {
        (local_210.ref)->refCount = (local_210.ref)->refCount + 1;
      }
      if (local_190 == (StringStorage *)0x0) {
LAB_00129745:
        local_228._1_2_ = _DAT_001d3301;
        local_220 = DAT_001d3308;
        local_228[0] = MiniScript::Value::emptyString;
      }
      else {
        uVar10 = MiniScript::HashValue((Value *)&local_218);
        psVar27 = &pSVar15->dataSize + uVar10 % 0xfb;
        do {
          psVar27 = (size_t *)*psVar27;
          if (psVar27 == (size_t *)0x0) goto LAB_00129745;
          bVar9 = MiniScript::Value::operator==((Value *)(psVar27 + 1),(Value *)&local_218);
        } while (!bVar9);
        local_228._1_2_ = *(undefined2 *)((long)psVar27 + 0x19);
        local_220.ref = ((anon_union_8_3_2f476f46_for_data *)(psVar27 + 4))->ref;
        local_228[0] = *(byte *)(psVar27 + 3);
      }
      if (local_220.ref != (RefCountedStorage *)0x0 && 2 < local_228[0]) {
        (local_220.ref)->refCount = (local_220.ref)->refCount + 1;
      }
      MiniScript::Value::ToString((Value *)&local_1e8,(Machine *)local_228);
      if (local_1e8.ref == (RefCountedStorage *)0x0) {
        aVar17 = local_200;
        if (local_200.ref != (RefCountedStorage *)0x0) {
          (local_200.ref)->refCount = (local_200.ref)->refCount + 1;
        }
      }
      else if (local_200.ref == (RefCountedStorage *)0x0) {
        (local_1e8.ref)->refCount = (local_1e8.ref)->refCount + 1;
        aVar17 = local_1e8;
      }
      else {
        local_208.number = local_200.number;
        lVar34 = local_200.ref[1].refCount;
        local_230.number = local_1e8.number;
        sVar28 = local_1e8.ref[1].refCount;
        aVar17.ref = (RefCountedStorage *)operator_new(0x30);
        uVar31 = lVar34 + (sVar28 - 1);
        (aVar17.ref)->refCount = 1;
        (aVar17.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
        aVar17.ref[1].refCount = uVar31;
        aVar17.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
        local_90 = sVar28;
        pp_Var18 = (_func_int **)operator_new__(uVar31);
        sVar28 = lVar34 - 1;
        aVar17.ref[1]._vptr_RefCountedStorage = pp_Var18;
        memset(pp_Var18,0,uVar31);
        memcpy(pp_Var18,local_208.ref[1]._vptr_RefCountedStorage,sVar28);
        memcpy((void *)(sVar28 + (long)pp_Var18),local_230.ref[1]._vptr_RefCountedStorage,local_90);
      }
      aVar21 = local_1b8;
      if (local_1b8.ref != (RefCountedStorage *)0x0) {
        uVar31 = local_1b8.ref[1].refCount;
        if (lVar22 + uVar32 + 1 < uVar31) {
          local_208 = aVar17;
          local_230.ref = (RefCountedStorage *)operator_new(0x30);
          lVar34 = uVar31 - lVar22;
          uVar31 = ~uVar32 + lVar34;
          (local_230.ref)->refCount = 1;
          (local_230.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
          local_230.ref[1].refCount = uVar31;
          local_230.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
          pp_Var18 = (_func_int **)operator_new__(uVar31);
          local_230.ref[1]._vptr_RefCountedStorage = pp_Var18;
          memset(pp_Var18,0,uVar31);
          memcpy(pp_Var18,(void *)((long)aVar21.ref[1]._vptr_RefCountedStorage + uVar32 + lVar22 + 1
                                  ),(lVar34 - uVar32) - 2);
          aVar21 = local_230;
          aVar17 = local_208;
        }
        else {
          aVar21.number = 0.0;
        }
      }
      if (aVar21.ref == (RefCountedStorage *)0x0) {
        local_238 = (RefCountedStorage *)((ulong)local_238._1_7_ << 8);
        local_240 = aVar17;
        if (aVar17.ref != (RefCountedStorage *)0x0) {
          (aVar17.ref)->refCount = (aVar17.ref)->refCount + 1;
        }
      }
      else if (aVar17.ref == (RefCountedStorage *)0x0) {
        local_238 = (RefCountedStorage *)((ulong)local_238._1_7_ << 8);
        (aVar21.ref)->refCount = (aVar21.ref)->refCount + 1;
        local_240 = aVar21;
      }
      else {
        lVar22 = aVar17.ref[1].refCount;
        sVar28 = aVar21.ref[1].refCount;
        local_230 = aVar21;
        aVar23.ref = (RefCountedStorage *)operator_new(0x30);
        uVar32 = lVar22 + (sVar28 - 1);
        (aVar23.ref)->refCount = 1;
        (aVar23.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
        aVar23.ref[1].refCount = uVar32;
        aVar23.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
        pp_Var18 = (_func_int **)operator_new__(uVar32);
        sVar6 = lVar22 - 1;
        aVar23.ref[1]._vptr_RefCountedStorage = pp_Var18;
        memset(pp_Var18,0,uVar32);
        memcpy(pp_Var18,aVar17.ref[1]._vptr_RefCountedStorage,sVar6);
        aVar21 = local_230;
        memcpy((void *)(sVar6 + (long)pp_Var18),local_230.ref[1]._vptr_RefCountedStorage,sVar28);
        local_238 = (RefCountedStorage *)((ulong)local_238 & 0xffffffffffffff00);
        local_240.ref = aVar23.ref;
      }
      MiniScript::String::operator=((String *)&local_1b8,(String *)&local_240);
LAB_0012a255:
      if ((local_240.ref != (RefCountedStorage *)0x0) && ((char)local_238 == '\0')) {
        plVar13 = &(local_240.ref)->refCount;
        *plVar13 = *plVar13 + -1;
        if (*plVar13 == 0) {
          (*(local_240.ref)->_vptr_RefCountedStorage[1])();
        }
        local_240.number = 0.0;
      }
      if (aVar21.ref != (RefCountedStorage *)0x0) {
        plVar13 = &(aVar21.ref)->refCount;
        *plVar13 = *plVar13 + -1;
        if (*plVar13 == 0) {
          (*(aVar21.ref)->_vptr_RefCountedStorage[1])(aVar21.number);
        }
      }
      if (aVar17.ref != (RefCountedStorage *)0x0) {
        plVar13 = &(aVar17.ref)->refCount;
        *plVar13 = *plVar13 + -1;
        if (*plVar13 == 0) {
          pp_Var18 = (aVar17.ref)->_vptr_RefCountedStorage;
LAB_0012a2a2:
          (*pp_Var18[1])(aVar17.number);
        }
      }
    }
LAB_0012a2a5:
    if ((local_1e8.ref != (RefCountedStorage *)0x0) && (local_1e0.tempNum._0_1_ == '\0')) {
      plVar13 = &(local_1e8.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_1e8.ref)->_vptr_RefCountedStorage[1])();
      }
      local_1e8.number = 0.0;
    }
    if ((2 < local_228[0]) && (local_220.ref != (RefCountedStorage *)0x0)) {
      plVar13 = &(local_220.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_220.ref)->_vptr_RefCountedStorage[1])();
      }
      local_220.number = 0.0;
    }
    if ((2 < (byte)local_218.tempNum._0_1_) && (local_210.ref != (RefCountedStorage *)0x0)) {
      plVar13 = &(local_210.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_210.ref)->_vptr_RefCountedStorage[1])();
      }
      local_210.number = 0.0;
    }
    if ((local_200.ref != (RefCountedStorage *)0x0) && (local_1f8 == Null)) {
      plVar13 = &(local_200.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_200.ref)->_vptr_RefCountedStorage[1])();
      }
      local_200.number = 0.0;
    }
    if (local_1f0.ref != (RefCountedStorage *)0x0) {
      plVar13 = &(local_1f0.ref)->refCount;
      *plVar13 = *plVar13 + -1;
      if (*plVar13 == 0) {
        (*(local_1f0.ref)->_vptr_RefCountedStorage[1])();
      }
    }
    goto LAB_001293bc;
  }
LAB_0012a66a:
  iVar11 = 0x1a7ab6;
  MiniScript::operator+((MiniScript *)&local_88,"import: library not found: ",(String *)&local_f8);
  if (local_88 != (StringStorage *)0x0) {
    plVar13 = &(local_88->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + 1;
  }
  local_198 = (undefined1  [8])&PTR__MiniscriptException_001d1358;
  local_190 = (StringStorage *)0x0;
  local_188 = false;
  local_180.tempNum = 0;
  local_170[0].tempNum._0_1_ = false;
  local_178 = local_88;
  if ((local_88 != (StringStorage *)0x0) && ((local_88->super_RefCountedStorage).refCount == 0)) {
    (*(local_88->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
  }
  local_198 = (undefined1  [8])&PTR__MiniscriptException_001d1308;
  MiniScript::RuntimeException::raise((RuntimeException *)local_198,iVar11);
  local_198 = (undefined1  [8])&PTR__MiniscriptException_001d1358;
  if ((local_178 != (StringStorage *)0x0) && ((bool)local_170[0]._0_1_ == false)) {
    plVar13 = &(local_178->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_178->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_178 = (StringStorage *)0x0;
  }
  if ((local_190 != (StringStorage *)0x0) && (local_188 == false)) {
    plVar13 = &(local_190->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_190->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_190 = (StringStorage *)0x0;
  }
  std::exception::~exception((exception *)local_198);
  if ((local_88 != (StringStorage *)0x0) && (local_80 == '\0')) {
    plVar13 = &(local_88->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_88->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_88 = (StringStorage *)0x0;
  }
LAB_0012a7a0:
  MiniScript::Parser::Parser((Parser *)local_198);
  MiniScript::String::operator+((String *)&local_240,(char *)&local_f8.tempNum);
  MiniScript::String::operator=((String *)local_198,(String *)&local_240);
  if ((local_240.ref != (RefCountedStorage *)0x0) && ((char)local_238 == '\0')) {
    plVar13 = &(local_240.ref)->refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_240.ref)->_vptr_RefCountedStorage[1])();
    }
    local_240.number = 0.0;
  }
  local_b0.isTemp = false;
  local_b0.ss = local_e0.ss;
  if (local_e0.ss != (StringStorage *)0x0) {
    plVar13 = &((local_e0.ss)->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + 1;
  }
  MiniScript::Parser::Parse((Parser *)local_198,&local_b0,false);
  if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
    plVar13 = &((local_b0.ss)->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_b0.ss = (StringStorage *)0x0;
  }
  func = MiniScript::Parser::CreateImport((Parser *)local_198);
  local_50.type = Temp;
  local_50.noInvoke = false;
  local_50.localOnly = Off;
  local_50.data.ref = (RefCountedStorage *)((ulong)(uint)local_50.data._4_4_ << 0x20);
  MiniScript::Machine::ManuallyPushCall((Machine *)local_e8[7].ss,func,&local_50);
  if ((Temp < local_50.type) && (local_50.data.ref != (RefCountedStorage *)0x0)) {
    plVar13 = &(local_50.data.ref)->refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_50.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_50.data.number = 0.0;
  }
  pCVar3 = local_1c8;
  local_c0.type = String;
  local_c0.noInvoke = false;
  local_c0.localOnly = Off;
  local_c0.data = local_f8;
  if (local_f8.ref == (RefCountedStorage *)0x0) {
    local_c0.data = DAT_001d3308;
  }
  if (local_c0.data.ref != (RefCountedStorage *)0x0) {
    (local_c0.data.ref)->refCount = (local_c0.data.ref)->refCount + 1;
  }
  ((RefCountedStorage *)&local_1c8->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)local_1c8);
  MiniScript::Value::operator=
            ((Value *)(((RefCountedStorage *)&pCVar3->code)->_vptr_RefCountedStorage + 3),&local_c0)
  ;
  *(undefined1 *)(((RefCountedStorage *)&pCVar3->code)->_vptr_RefCountedStorage + 2) = 0;
  if ((Temp < local_c0.type) && (local_c0.data.ref != (RefCountedStorage *)0x0)) {
    plVar13 = &(local_c0.data.ref)->refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_c0.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_c0.data.number = 0.0;
  }
  MiniScript::Parser::~Parser((Parser *)local_198);
  if ((local_e0.ss != (StringStorage *)0x0) && (local_e0.isTemp == false)) {
    plVar13 = &((local_e0.ss)->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*((local_e0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_e0.ss = (StringStorage *)0x0;
  }
  if ((local_108.ls != (ListStorage<MiniScript::String> *)0x0) && (local_108.isTemp == false)) {
    plVar13 = &((local_108.ls)->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*((local_108.ls)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      local_108.ls = (ListStorage<MiniScript::String> *)0x0;
    }
  }
  if ((2 < local_1a8[0]) && (local_1a0 != (long *)0x0)) {
    plVar13 = local_1a0 + 1;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (**(code **)(*local_1a0 + 8))();
    }
    local_1a0 = (long *)0x0;
  }
  if ((local_f8.ref != (RefCountedStorage *)0x0) && (local_f0 == '\0')) {
    plVar13 = &(local_f8.ref)->refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_f8.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)local_1c8;
LAB_0012a360:
  local_98 = '\0';
  local_a0.number = aVar17.number;
  if (aVar17.ref != (RefCountedStorage *)0x0) {
    (aVar17.ref)->refCount = (aVar17.ref)->refCount + 1;
  }
  local_198 = (undefined1  [8])&PTR__Dictionary_001d1238;
  if ((local_190 != (StringStorage *)0x0) && (local_188 == false)) {
    plVar13 = &(local_190->super_RefCountedStorage).refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_190->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_190 = (StringStorage *)0x0;
  }
  MiniScript::String::operator=((String *)&local_1d8,(String *)&local_a0);
  if ((local_a0.ref != (RefCountedStorage *)0x0) && (local_98 == '\0')) {
    plVar13 = &(local_a0.ref)->refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_a0.ref)->_vptr_RefCountedStorage[1])();
    }
    local_a0.number = 0.0;
  }
  if ((local_1b8.ref != (RefCountedStorage *)0x0) && (local_1b0.tempNum._0_1_ == '\0')) {
    plVar13 = &(local_1b8.ref)->refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_1b8.ref)->_vptr_RefCountedStorage[1])();
    }
    local_1b8.number = 0.0;
  }
  pp_Var18 = (_func_int **)0x1a780e;
  if (local_1d8.ref != (RefCountedStorage *)0x0) {
    pp_Var18 = local_1d8.ref[1]._vptr_RefCountedStorage;
  }
  __stream = fopen((char *)pp_Var18,"r");
  if (__stream != (FILE *)0x0) {
    ReadFileHelper((FILE *)local_198,(long)__stream);
    MiniScript::String::operator=(&local_e0,(String *)local_198);
    if ((local_198 != (undefined1  [8])0x0) && (local_190._0_1_ == false)) {
      pp_Var1 = (TextOutputMethod *)((long)local_198 + 8);
      *pp_Var1 = *pp_Var1 + -1;
      if (*pp_Var1 == (TextOutputMethod)0x0) {
        (*(*(_func_int ***)local_198)[1])();
      }
      local_198 = (undefined1  [8])0x0;
    }
    iVar11 = fclose(__stream);
    local_58 = CONCAT71((int7)(CONCAT44(extraout_var,iVar11) >> 8),1);
  }
  if ((local_1d8.ref != (RefCountedStorage *)0x0) && (local_1d0.tempNum._0_1_ == '\0')) {
    plVar13 = &(local_1d8.ref)->refCount;
    *plVar13 = *plVar13 + -1;
    if (*plVar13 == 0) {
      (*(local_1d8.ref)->_vptr_RefCountedStorage[1])();
    }
    local_1d8.number = 0.0;
  }
  if ((__stream != (FILE *)0x0) || (uVar33 = local_38 + 1, uVar33 == local_40)) goto LAB_0012a65c;
  goto LAB_0012913b;
LAB_0012a65c:
  if ((local_58 & 1) != 0) goto LAB_0012a7a0;
  goto LAB_0012a66a;
}

Assistant:

static IntrinsicResult intrinsic_import(Context *context, IntrinsicResult partialResult) {
	if (!partialResult.Result().IsNull()) {
		// When we're invoked with a partial result, it means that the import
		// function has finished, and stored its result (the values that were
		// created by the import code) in Temp 0.
		Value importedValues = context->GetTemp(0);
		// Now we're going to do something slightly evil.  We're going to reach
		// up into the *parent* context, and store these imported values under
		// the import library name.  Thus, there will always be a standard name
		// by which you can refer to the imported stuff.
		String libname = partialResult.Result().ToString();
		Context *callerContext = context->parent;
		callerContext->SetVar(libname, importedValues);
		return IntrinsicResult::Null;
	}
	// When we're invoked without a partial result, it's time to start the import.
	// Begin by finding the actual code.
	String libname = context->GetVar("libname").ToString();
	if (libname.empty()) {
		RuntimeException("import: libname required").raise();
	}
	
	// Figure out what directories to look for the import modules in.
	Value searchPath = getEnvMap().Lookup(_MS_IMPORT_PATH, Value::null);
	StringList libDirs;
	if (!searchPath.IsNull()) libDirs = Split(searchPath.ToString(), ":");
	
	// Search the lib dirs for a matching file.
	String moduleSource;
	bool found = false;
	for (long i=0, len=libDirs.Count(); i<len; i++) {
		String path = libDirs[i];
		if (path.empty()) path = ".";
		else if (path[path.LengthB() - 1] != PATHSEP) path += String(PATHSEP);
		path += libname + ".ms";
		path = ExpandVariables(path);
		FILE *handle = fopen(path.c_str(), "r");
		if (handle == nullptr) continue;
		moduleSource = ReadFileHelper(handle, -1);
		fclose(handle);
		found = true;
		break;
	}
	if (!found) {
		RuntimeException("import: library not found: " + libname).raise();
	}
	
	// Now, parse that code, and build a function around it that returns
	// its own locals as its result.  Push a manual call.
	Parser parser;
	parser.errorContext = libname + ".ms";
	parser.Parse(moduleSource);
	FunctionStorage *import = parser.CreateImport();
	context->vm->ManuallyPushCall(import, Value::Temp(0));
	
	// That call will not be able to run until we return from this intrinsic.
	// So, return a partial result, with the lib name.  We'll get invoked
	// again after the import function has finished running.
	return IntrinsicResult(libname, false);
}